

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  mapped_type mVar1;
  undefined8 uVar2;
  bool bVar3;
  ConcatLayerParams *this_00;
  string *psVar4;
  mapped_type *pmVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  reference __k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string err;
  _Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *input;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  _Self local_1a8;
  mapped_type local_1a0;
  allocator local_199;
  int rank;
  Result local_178;
  undefined1 local_148 [32];
  Result local_128;
  undefined1 local_f8 [32];
  Result local_d8;
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,2,-1);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  if (bVar3) {
    validateOutputCount((Result_conflict *)&local_a8,(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),&local_a8);
    Result::~Result(&local_a8);
  }
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  uVar2 = r._32_8_;
  if (!bVar3) {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_d8.m_message._M_storage._M_storage[4] = '\x01';
    local_d8.m_message._M_storage._M_storage[5] = '\0';
    local_d8.m_message._M_storage._M_storage[6] = '\0';
    local_d8.m_message._M_storage._M_storage[7] = '\0';
    goto LAB_0040ff34;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_f8,"Concat",
               (allocator *)((long)local_128.m_message._M_storage._M_storage + 7));
    validateInputOutputRankEquality
              ((Result_conflict *)(local_f8 + 0x20),(NeuralNetworkLayer *)uVar2,(string *)local_f8,
               &this->blobNameToRank);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_f8 + 0x20));
    Result::~Result((Result *)(local_f8 + 0x20));
    std::__cxx11::string::~string((string *)local_f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_128.m_message._M_storage._M_storage + 7));
    bVar3 = Result::good((Result *)(local_70 + 0x28));
    if (!bVar3) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_d8.m_message._M_storage._M_storage[4] = '\x01';
      local_d8.m_message._M_storage._M_storage[5] = '\0';
      local_d8.m_message._M_storage._M_storage[6] = '\0';
      local_d8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_0040ff34;
    }
    this_00 = Specification::NeuralNetworkLayer::concat((NeuralNetworkLayer *)r._32_8_);
    bVar3 = Specification::ConcatLayerParams::sequenceconcat(this_00);
    uVar2 = r._32_8_;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_148,"Concat",
                 (allocator *)(local_178.m_message._M_storage._M_storage + 7));
      validateRankCount((Result_conflict *)(local_148 + 0x20),(NeuralNetworkLayer *)uVar2,
                        (string *)local_148,5,-1,&this->blobNameToRank);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_148 + 0x20));
      Result::~Result((Result *)(local_148 + 0x20));
      std::__cxx11::string::~string((string *)local_148);
      std::allocator<char>::~allocator
                ((allocator<char> *)(local_178.m_message._M_storage._M_storage + 7));
      bVar3 = Result::good((Result *)(local_70 + 0x28));
      if (!bVar3) {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        local_d8.m_message._M_storage._M_storage[4] = '\x01';
        local_d8.m_message._M_storage._M_storage[5] = '\0';
        local_d8.m_message._M_storage._M_storage[6] = '\0';
        local_d8.m_message._M_storage._M_storage[7] = '\0';
        goto LAB_0040ff34;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&rank,"Concat",&local_199);
      validateRankCount((Result_conflict *)&local_178,(NeuralNetworkLayer *)uVar2,(string *)&rank,3,
                        -1,&this->blobNameToRank);
      Result::operator=((Result *)(local_70 + 0x28),&local_178);
      Result::~Result(&local_178);
      std::__cxx11::string::~string((string *)&rank);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      bVar3 = Result::good((Result *)(local_70 + 0x28));
      if (!bVar3) {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        local_d8.m_message._M_storage._M_storage[4] = '\x01';
        local_d8.m_message._M_storage._M_storage[5] = '\0';
        local_d8.m_message._M_storage._M_storage[6] = '\0';
        local_d8.m_message._M_storage._M_storage[7] = '\0';
        goto LAB_0040ff34;
      }
    }
    local_1a0 = 0;
    psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_((NeuralNetworkLayer *)r._32_8_,0);
    local_1a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&this->blobNameToRank,(key_type *)psVar4);
    __range2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::end(&this->blobNameToRank);
    bVar3 = std::operator!=(&local_1a8,(_Self *)&__range2);
    if (!bVar3) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_d8.m_message._M_storage._M_storage[4] = '\x01';
      local_d8.m_message._M_storage._M_storage[5] = '\0';
      local_d8.m_message._M_storage._M_storage[6] = '\0';
      local_d8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_0040ff34;
    }
    psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_((NeuralNetworkLayer *)r._32_8_,0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(&this->blobNameToRank,psVar4);
    local_1a0 = *pmVar5;
    this_01 = Specification::NeuralNetworkLayer::input_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
    __end2 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(this_01);
    input = (_Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(this_01);
    while (bVar3 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&__end2,(iterator *)&input), bVar3) {
      __k = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end2);
      err._M_storage._M_storage =
           (uchar  [8])
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&this->blobNameToRank,(key_type *)__k);
      err.super__Rb_tree_node_base._M_right =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&this->blobNameToRank);
      bVar3 = std::operator!=((_Self *)&err._M_storage,
                              (_Self *)&err.super__Rb_tree_node_base._M_right);
      mVar1 = local_1a0;
      if ((bVar3) &&
         (pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(&this->blobNameToRank,__k), mVar1 != *pmVar5)) {
        std::__cxx11::string::string((string *)local_200);
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
        std::__cxx11::string::string((string *)&local_260,(string *)psVar4);
        std::operator+(&local_240,"Layer \'",&local_260);
        std::operator+(&local_220,&local_240,
                       "\' of type \'Concat\' expects equal ranks for its inputs, but they are not equal."
                      );
        std::__cxx11::string::operator=((string *)local_200,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_200
                      );
        local_d8.m_message._M_storage._M_storage[4] = '\x01';
        local_d8.m_message._M_storage._M_storage[5] = '\0';
        local_d8.m_message._M_storage._M_storage[6] = '\0';
        local_d8.m_message._M_storage._M_storage[7] = '\0';
        std::__cxx11::string::~string((string *)local_200);
        goto LAB_0040ff34;
      }
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
  local_d8.m_message._M_storage._M_storage[4] = '\x01';
  local_d8.m_message._M_storage._M_storage[5] = '\0';
  local_d8.m_message._M_storage._M_storage[6] = '\0';
  local_d8.m_message._M_storage._M_storage[7] = '\0';
LAB_0040ff34:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Concat", blobNameToRank);
        if (!r.good()) {return r;}
        if (layer.concat().sequenceconcat()) {
            r = validateRankCount(layer, "Concat", 5, -1, blobNameToRank);
            if (!r.good()) {return r;}
        } else {
            r = validateRankCount(layer, "Concat", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return r;
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}